

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.cpp
# Opt level: O1

int OpenMD::isEndLine(char *line)

{
  int iVar1;
  char *__s;
  char *__s1;
  
  __s = strdup(line);
  __s1 = strtok(__s," ,;\t");
  if (__s1 != (char *)0x0) {
    iVar1 = strcasecmp(__s1,"end");
    if (iVar1 == 0) {
      iVar1 = 1;
      goto LAB_002453d0;
    }
  }
  iVar1 = 0;
LAB_002453d0:
  free(__s);
  return iVar1;
}

Assistant:

int isEndLine(char* line) {
    char* working_line;
    char* foo;

    working_line = strdup(line);

    foo = strtok(working_line, " ,;\t");

    if (foo != NULL) {
      if (!strcasecmp(foo, "end")) {
        free(working_line);
        return 1;
      }
    }

    free(working_line);
    return 0;
  }